

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_database.cpp
# Opt level: O2

void __thiscall
Database_Allocate16BytesAligned1024_Test::~Database_Allocate16BytesAligned1024_Test
          (Database_Allocate16BytesAligned1024_Test *this)

{
  anon_unknown.dwarf_59778::Database::~Database(&this->super_Database);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST_F (Database, Allocate16BytesAligned1024) {
    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    constexpr unsigned size = 16;
    constexpr unsigned align = 1024;
    PSTORE_STATIC_ASSERT (align > pstore::leader_size + sizeof (pstore::trailer));

    pstore::address addr = db.allocate (size, align);
    EXPECT_EQ (0U, addr.absolute () % align);

    pstore::address addr2 = db.allocate (size, align);
    EXPECT_EQ (addr.absolute () + align, addr2.absolute ());
}